

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O1

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,lcg64_shift *R)

{
  undefined4 uVar1;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  status_type S_new;
  parameter_type P_new;
  delim_c local_64;
  delim_c local_63;
  delim_c local_62;
  delim_c local_61;
  lcg64_shift *local_60;
  delim_str local_58;
  status_type local_50;
  parameter_type local_48;
  
  local_48.a = 0;
  local_48.b = 0;
  local_50.r = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_60 = R;
  utility::operator>>(in,(ignore_spaces_cl *)&local_58);
  local_61.c = '[';
  pbVar2 = utility::operator>>(in,&local_61);
  local_58.str = lcg64_shift::name();
  pbVar2 = utility::operator>>(pbVar2,&local_58);
  local_62.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_62);
  pbVar2 = operator>>(pbVar2,&local_48);
  local_63.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_63);
  pbVar2 = operator>>(pbVar2,&local_50);
  local_64.c = ']';
  utility::operator>>(pbVar2,&local_64);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    (local_60->P).a = local_48.a;
    (local_60->P).b = local_48.b;
    (local_60->S).r = local_50.r;
  }
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, lcg64_shift &R) {
      lcg64_shift::parameter_type P_new;
      lcg64_shift::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(lcg64_shift::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }